

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O1

bool __thiscall ELFIO::elfio::load(elfio *this,istream *stream,bool is_lazy)

{
  pointer puVar1;
  pointer puVar2;
  section *psVar3;
  pointer puVar4;
  pointer puVar5;
  segment *psVar6;
  long lVar7;
  long lVar8;
  elf_header *peVar9;
  Sections SVar10;
  bool bVar11;
  int iVar12;
  const_iterator __begin2;
  pointer paVar13;
  long lVar14;
  pointer *__ptr;
  pointer puVar15;
  pointer puVar16;
  array<char,_16UL> e_ident;
  undefined8 local_48;
  undefined8 uStack_40;
  Sections local_38;
  
  puVar1 = (this->sections_).
           super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->sections_).
           super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar15 = puVar1;
  if (puVar2 != puVar1) {
    do {
      psVar3 = (puVar15->_M_t).
               super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>._M_t.
               super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
               super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl;
      if (psVar3 != (section *)0x0) {
        (*psVar3->_vptr_section[1])();
      }
      (puVar15->_M_t).super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>.
      _M_t.super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
      super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl = (section *)0x0;
      puVar15 = puVar15 + 1;
    } while (puVar15 != puVar2);
    (this->sections_).
    super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  puVar4 = (this->segments_).
           super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar5 = (this->segments_).
           super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar16 = puVar4;
  if (puVar5 != puVar4) {
    do {
      psVar6 = (puVar16->_M_t).
               super___uniq_ptr_impl<ELFIO::segment,_std::default_delete<ELFIO::segment>_>._M_t.
               super__Tuple_impl<0UL,_ELFIO::segment_*,_std::default_delete<ELFIO::segment>_>.
               super__Head_base<0UL,_ELFIO::segment_*,_false>._M_head_impl;
      if (psVar6 != (segment *)0x0) {
        (*psVar6->_vptr_segment[1])();
      }
      (puVar16->_M_t).super___uniq_ptr_impl<ELFIO::segment,_std::default_delete<ELFIO::segment>_>.
      _M_t.super__Tuple_impl<0UL,_ELFIO::segment_*,_std::default_delete<ELFIO::segment>_>.
      super__Head_base<0UL,_ELFIO::segment_*,_false>._M_head_impl = (segment *)0x0;
      puVar16 = puVar16 + 1;
    } while (puVar16 != puVar5);
    (this->segments_).
    super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar4;
  }
  local_48 = 0;
  uStack_40 = 0;
  paVar13 = (this->addr_translator).addr_translations.
            super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar14 = 0;
  do {
    if (paVar13 ==
        (this->addr_translator).addr_translations.
        super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
LAB_0010671d:
      std::istream::seekg(stream,lVar14,0);
      std::istream::read((char *)stream,(long)&local_48);
      if (((((*(long *)(stream + 8) == 0x10) && ((char)local_48 == '\x7f')) &&
           (local_48._1_1_ == 'E')) && ((local_48._2_1_ == 'L' && (local_48._3_1_ == 'F')))) &&
         (((byte)(local_48._4_1_ - 1) < 2 && ((byte)(local_48._5_1_ - 1U) < 2)))) {
        (this->convertor).need_conversion = local_48._5_1_ != '\x01';
        create_header((elfio *)&stack0xffffffffffffffc8,(uchar)this,local_48._4_1_);
        SVar10.parent = local_38.parent;
        local_38.parent = (elfio *)0x0;
        peVar9 = (this->header)._M_t.
                 super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>
                 .super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
        (this->header)._M_t.
        super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
        super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
        super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl = (elf_header *)SVar10.parent
        ;
        if (peVar9 != (elf_header *)0x0) {
          (*peVar9->_vptr_elf_header[1])();
        }
        if (local_38.parent != (elfio *)0x0) {
          (*(code *)((((local_38.parent)->sections).parent)->segments).parent)();
        }
        peVar9 = (this->header)._M_t.
                 super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>
                 .super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
        if ((peVar9 != (elf_header *)0x0) &&
           (iVar12 = (*peVar9->_vptr_elf_header[2])(peVar9,stream), (char)iVar12 != '\0')) {
          load_sections(this,stream,is_lazy);
          bVar11 = load_segments(this,stream,is_lazy);
          return bVar11;
        }
      }
      return false;
    }
    lVar7 = *(long *)paVar13;
    if ((lVar7 < 1) &&
       (lVar8 = *(long *)(paVar13 + 0x10),
       lVar8 != -lVar7 && SBORROW8(lVar8,-lVar7) == lVar8 + lVar7 < 0)) {
      lVar14 = *(long *)(paVar13 + 0x20) - lVar7;
      goto LAB_0010671d;
    }
    paVar13 = paVar13 + 0x30;
  } while( true );
}

Assistant:

bool load( std::istream& stream, bool is_lazy = false )
    {
        sections_.clear();
        segments_.clear();

        std::array<char, EI_NIDENT> e_ident = { 0 };
        // Read ELF file signature
        stream.seekg( addr_translator[0] );
        stream.read( e_ident.data(), sizeof( e_ident ) );

        // Is it ELF file?
        if ( stream.gcount() != sizeof( e_ident ) ||
             e_ident[EI_MAG0] != ELFMAG0 || e_ident[EI_MAG1] != ELFMAG1 ||
             e_ident[EI_MAG2] != ELFMAG2 || e_ident[EI_MAG3] != ELFMAG3 ) {
            return false;
        }

        if ( ( e_ident[EI_CLASS] != ELFCLASS64 ) &&
             ( e_ident[EI_CLASS] != ELFCLASS32 ) ) {
            return false;
        }

        if ( ( e_ident[EI_DATA] != ELFDATA2LSB ) &&
             ( e_ident[EI_DATA] != ELFDATA2MSB ) ) {
            return false;
        }

        convertor.setup( e_ident[EI_DATA] );
        header = create_header( e_ident[EI_CLASS], e_ident[EI_DATA] );
        if ( nullptr == header ) {
            return false;
        }
        if ( !header->load( stream ) ) {
            return false;
        }

        load_sections( stream, is_lazy );
        bool is_still_good = load_segments( stream, is_lazy );
        return is_still_good;
    }